

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::PrintCompilerAdvice
          (cmGlobalGenerator *this,ostream *os,string *lang,cmValue envVar)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"Tell CMake where to find the compiler by setting ",0x31);
  if (envVar.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"either the environment variable \"",0x21)
    ;
    poVar1 = operator<<(os,envVar);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" or ",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"the CMake cache entry CMAKE_",0x1c);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(lang->_M_dataplus)._M_p,lang->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "_COMPILER to the full path to the compiler, or to the compiler name if it is in the PATH."
             ,0x59);
  return;
}

Assistant:

void cmGlobalGenerator::PrintCompilerAdvice(std::ostream& os,
                                            std::string const& lang,
                                            cmValue envVar) const
{
  // Subclasses override this method if they do not support this advice.
  os << "Tell CMake where to find the compiler by setting ";
  if (envVar) {
    os << "either the environment variable \"" << envVar << "\" or ";
  }
  os << "the CMake cache entry CMAKE_" << lang
     << "_COMPILER "
        "to the full path to the compiler, or to the compiler name "
        "if it is in the PATH.";
}